

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.hpp
# Opt level: O1

int mxx::right_shift<int>(int *t,comm *comm)

{
  int iVar1;
  int left_value;
  MPI_Request recv_req;
  datatype dt;
  int local_34;
  undefined1 local_30 [8];
  datatype local_28;
  
  local_28._vptr_datatype = (_func_int **)&PTR__datatype_0013d8d8;
  local_28.mpitype = (MPI_Datatype)&ompi_mpi_int;
  local_28.builtin = true;
  local_34 = 0;
  if (0 < comm->m_rank) {
    MPI_Irecv(&local_34,1,&ompi_mpi_int,comm->m_rank + -1,0xd,comm->mpi_comm,local_30);
  }
  if (comm->m_rank < comm->m_size + -1) {
    MPI_Send(t,1,local_28.mpitype,comm->m_rank + 1,0xd,comm->mpi_comm);
  }
  if (0 < comm->m_rank) {
    MPI_Wait(local_30,0);
  }
  iVar1 = local_34;
  datatype::~datatype(&local_28);
  return iVar1;
}

Assistant:

T right_shift(const T& t, const mxx::comm& comm = mxx::comm()) {
    // get datatype
    datatype dt = get_datatype<T>();

    // TODO: handle tags with MXX (get unique tag function)
    int tag = 13;

    T left_value = T();
    MPI_Request recv_req;
    // if not last processor
    if (comm.rank() > 0) {
        MPI_Irecv(&left_value, 1, dt.type(), comm.rank()-1, tag,
                  comm, &recv_req);
    }
    // if not first processor
    if (comm.rank() < comm.size()-1) {
        // send my most right element to the right
        MPI_Send(const_cast<T*>(&t), 1, dt.type(), comm.rank()+1, tag, comm);
    }
    if (comm.rank() > 0) {
        // wait for the async receive to finish
        MPI_Wait(&recv_req, MPI_STATUS_IGNORE);
    }
    return left_value;
}